

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_inter_pred_chroma_copy_w16out_sse42
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  uint uVar1;
  undefined8 *puVar2;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  uint in_R9D;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i src3_16x8b;
  __m128i src2_16x8b;
  __m128i src1_16x8b;
  __m128i src0_16x8b;
  WORD32 wdx2;
  WORD32 col;
  WORD32 row;
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  int local_564;
  int local_560;
  undefined8 *local_548;
  ulong *local_540;
  
  if ((int)src3_16x8b[1] % 2 != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0x1d4,
                  "void ihevc_inter_pred_chroma_copy_w16out_sse42(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((int)in_R9D % 2 != 0) {
    __assert_fail("(ht % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0x1d5,
                  "void ihevc_inter_pred_chroma_copy_w16out_sse42(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  uVar1 = (int)src3_16x8b[1] * 2;
  local_548 = in_RSI;
  local_540 = in_RDI;
  if ((in_R9D & 3) == 0) {
    if ((uVar1 & 7) == 0) {
      for (local_560 = 0; local_560 < (int)in_R9D; local_560 = local_560 + 4) {
        for (local_564 = 0; local_564 < (int)uVar1; local_564 = local_564 + 8) {
          local_578._8_8_ = 0;
          local_578._0_8_ = *local_540;
          local_588._8_8_ = 0;
          local_588._0_8_ = *(ulong *)((long)local_540 + (long)in_EDX);
          local_598._0_8_ = *(ulong *)((long)local_540 + (long)(in_EDX * 2));
          local_598._8_8_ = 0;
          local_5a8._0_8_ = *(ulong *)((long)local_540 + (long)(in_EDX * 3));
          local_5a8._8_8_ = 0;
          auVar3 = pmovzxbw(local_578,*local_540);
          auVar4 = pmovzxbw(local_588,*(ulong *)((long)local_540 + (long)in_EDX));
          auVar5 = pmovzxbw(local_598,local_598._0_8_);
          auVar6 = pmovzxbw(local_5a8,local_5a8._0_8_);
          auVar3 = psllw(auVar3,ZEXT416(6));
          auVar4 = psllw(auVar4,ZEXT416(6));
          auVar5 = psllw(auVar5,ZEXT416(6));
          auVar6 = psllw(auVar6,ZEXT416(6));
          local_578._0_8_ = auVar3._0_8_;
          local_578._8_8_ = auVar3._8_8_;
          *local_548 = local_578._0_8_;
          local_548[1] = local_578._8_8_;
          puVar2 = (undefined8 *)((long)local_548 + (long)in_ECX * 2);
          local_588._0_8_ = auVar4._0_8_;
          local_588._8_8_ = auVar4._8_8_;
          *puVar2 = local_588._0_8_;
          puVar2[1] = local_588._8_8_;
          puVar2 = (undefined8 *)((long)local_548 + (long)(in_ECX << 1) * 2);
          local_598._0_8_ = auVar5._0_8_;
          local_598._8_8_ = auVar5._8_8_;
          *puVar2 = local_598._0_8_;
          puVar2[1] = local_598._8_8_;
          puVar2 = (undefined8 *)((long)local_548 + (long)(in_ECX * 3) * 2);
          local_5a8._0_8_ = auVar6._0_8_;
          local_5a8._8_8_ = auVar6._8_8_;
          *puVar2 = local_5a8._0_8_;
          puVar2[1] = local_5a8._8_8_;
          local_540 = local_540 + 1;
          local_548 = local_548 + 2;
        }
        local_540 = (ulong *)((long)local_540 + (long)(in_EDX * 4 + (int)src3_16x8b[1] * -2));
        local_548 = (undefined8 *)
                    ((long)local_548 + (long)(in_ECX * 4 + (int)src3_16x8b[1] * -2) * 2);
      }
    }
    else {
      for (local_560 = 0; local_560 < (int)in_R9D; local_560 = local_560 + 4) {
        for (local_564 = 0; local_564 < (int)uVar1; local_564 = local_564 + 4) {
          local_578._8_8_ = 0;
          local_578._0_8_ = *local_540;
          local_588._8_8_ = 0;
          local_588._0_8_ = *(ulong *)((long)local_540 + (long)in_EDX);
          local_598._0_8_ = *(ulong *)((long)local_540 + (long)(in_EDX * 2));
          local_598._8_8_ = 0;
          local_5a8._0_8_ = *(ulong *)((long)local_540 + (long)(in_EDX * 3));
          local_5a8._8_8_ = 0;
          auVar3 = pmovzxbw(local_578,*local_540);
          auVar4 = pmovzxbw(local_588,*(ulong *)((long)local_540 + (long)in_EDX));
          auVar5 = pmovzxbw(local_598,local_598._0_8_);
          auVar6 = pmovzxbw(local_5a8,local_5a8._0_8_);
          auVar3 = psllw(auVar3,ZEXT416(6));
          auVar4 = psllw(auVar4,ZEXT416(6));
          auVar5 = psllw(auVar5,ZEXT416(6));
          auVar6 = psllw(auVar6,ZEXT416(6));
          local_578._0_8_ = auVar3._0_8_;
          *local_548 = local_578._0_8_;
          local_588._0_8_ = auVar4._0_8_;
          *(undefined8 *)((long)local_548 + (long)in_ECX * 2) = local_588._0_8_;
          local_598._0_8_ = auVar5._0_8_;
          *(undefined8 *)((long)local_548 + (long)(in_ECX * 2) * 2) = local_598._0_8_;
          local_5a8._0_8_ = auVar6._0_8_;
          *(undefined8 *)((long)local_548 + (long)(in_ECX * 3) * 2) = local_5a8._0_8_;
          local_540 = (ulong *)((long)local_540 + 4);
          local_548 = local_548 + 1;
        }
        local_540 = (ulong *)((long)local_540 + (long)(in_EDX * 4 + (int)src3_16x8b[1] * -2));
        local_548 = (undefined8 *)
                    ((long)local_548 + (long)(in_ECX * 4 + (int)src3_16x8b[1] * -2) * 2);
      }
    }
  }
  else if ((uVar1 & 7) == 0) {
    for (local_560 = 0; local_560 < (int)in_R9D; local_560 = local_560 + 2) {
      for (local_564 = 0; local_564 < (int)uVar1; local_564 = local_564 + 8) {
        local_578._8_8_ = 0;
        local_578._0_8_ = *local_540;
        local_588._8_8_ = 0;
        local_588._0_8_ = *(ulong *)((long)local_540 + (long)in_EDX);
        auVar3 = pmovzxbw(local_578,*local_540);
        auVar4 = pmovzxbw(local_588,*(ulong *)((long)local_540 + (long)in_EDX));
        auVar3 = psllw(auVar3,ZEXT416(6));
        auVar4 = psllw(auVar4,ZEXT416(6));
        local_578._0_8_ = auVar3._0_8_;
        local_578._8_8_ = auVar3._8_8_;
        *local_548 = local_578._0_8_;
        local_548[1] = local_578._8_8_;
        puVar2 = (undefined8 *)((long)local_548 + (long)in_ECX * 2);
        local_588._0_8_ = auVar4._0_8_;
        local_588._8_8_ = auVar4._8_8_;
        *puVar2 = local_588._0_8_;
        puVar2[1] = local_588._8_8_;
        local_540 = local_540 + 1;
        local_548 = local_548 + 2;
      }
      local_540 = (ulong *)((long)local_540 + (long)(in_EDX * 2 + (int)src3_16x8b[1] * -2));
      local_548 = (undefined8 *)((long)local_548 + (long)(in_ECX * 2 + (int)src3_16x8b[1] * -2) * 2)
      ;
    }
  }
  else {
    for (local_560 = 0; local_560 < (int)in_R9D; local_560 = local_560 + 2) {
      for (local_564 = 0; local_564 < (int)uVar1; local_564 = local_564 + 4) {
        local_578._8_8_ = 0;
        local_578._0_8_ = *local_540;
        local_588._8_8_ = 0;
        local_588._0_8_ = *(ulong *)((long)local_540 + (long)in_EDX);
        auVar3 = pmovzxbw(local_578,*local_540);
        auVar4 = pmovzxbw(local_588,*(ulong *)((long)local_540 + (long)in_EDX));
        auVar3 = psllw(auVar3,ZEXT416(6));
        auVar4 = psllw(auVar4,ZEXT416(6));
        local_578._0_8_ = auVar3._0_8_;
        *local_548 = local_578._0_8_;
        local_588._0_8_ = auVar4._0_8_;
        *(undefined8 *)((long)local_548 + (long)in_ECX * 2) = local_588._0_8_;
        local_540 = (ulong *)((long)local_540 + 4);
        local_548 = local_548 + 1;
      }
      local_540 = (ulong *)((long)local_540 + (long)(in_EDX * 2 + (int)src3_16x8b[1] * -2));
      local_548 = (undefined8 *)((long)local_548 + (long)(in_ECX * 2 + (int)src3_16x8b[1] * -2) * 2)
      ;
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_copy_w16out_sse42(UWORD8 *pu1_src,
                                               WORD16 *pi2_dst,
                                               WORD32 src_strd,
                                               WORD32 dst_strd,
                                               WORD8 *pi1_coeff,
                                               WORD32 ht,
                                               WORD32 wd)
{
    WORD32 row, col, wdx2;
    __m128i  src0_16x8b, src1_16x8b, src2_16x8b, src3_16x8b;

    ASSERT(wd % 2 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/
    UNUSED(pi1_coeff);
    wdx2 = wd * 2;

    if(0 == (ht & 3)) /* multiple of 4 case */
    {
        if(0 == (wdx2 & 7)) /* multiple of 8 case */
        {
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wdx2; col += 8)
                {
                    /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                    src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                    src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                    src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                    src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);
                    src2_16x8b = _mm_cvtepu8_epi16(src2_16x8b);
                    src3_16x8b = _mm_cvtepu8_epi16(src3_16x8b);

                    src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                    src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                    src2_16x8b = _mm_slli_epi16(src2_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                    src3_16x8b = _mm_slli_epi16(src3_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                    /* storing 16 8-bit output values */
                    _mm_storeu_si128((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                    _mm_storeu_si128((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                    _mm_storeu_si128((__m128i *)(pi2_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                    _mm_storeu_si128((__m128i *)(pi2_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                    pu1_src += 8; /* pointer update */
                    pi2_dst += 8; /* pointer update */
                } /* inner for loop ends here(8-output values in single iteration) */

                pu1_src += 4 * src_strd - wdx2; /* pointer update */
                pi2_dst += 4 * dst_strd - wdx2; /* pointer update */
            }
        }
        else /* wdx2 = multiple of 4 case */
        {
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wdx2; col += 4)
                {
                    /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                    src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                    src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                    src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                    src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);
                    src2_16x8b = _mm_cvtepu8_epi16(src2_16x8b);
                    src3_16x8b = _mm_cvtepu8_epi16(src3_16x8b);

                    src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                    src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                    src2_16x8b = _mm_slli_epi16(src2_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                    src3_16x8b = _mm_slli_epi16(src3_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                    /* storing 16 8-bit output values */
                    _mm_storel_epi64((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                    _mm_storel_epi64((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                    _mm_storel_epi64((__m128i *)(pi2_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                    _mm_storel_epi64((__m128i *)(pi2_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                    pu1_src += 4; /* pointer update */
                    pi2_dst += 4; /* pointer update */
                } /* inner for loop ends here(4-output values in single iteration) */

                pu1_src += 4 * src_strd - wdx2; /* pointer update */
                pi2_dst += 4 * dst_strd - wdx2; /* pointer update */
            }
        }
    }
    else  /* ht multiple of 2 case */
    {
        if(0 == (wdx2 & 7)) /* multiple of 8 case */
        {
            for(row = 0; row < ht; row += 2)
            {
                for(col = 0; col < wdx2; col += 8)
                {
                    /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */

                    src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                    src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);

                    src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                    src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                    /* storing 16 8-bit output values */
                    _mm_storeu_si128((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                    _mm_storeu_si128((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */

                    pu1_src += 8; /* pointer update */
                    pi2_dst += 8; /* pointer update */
                } /* inner for loop ends here(8-output values in single iteration) */

                pu1_src += 2 * src_strd - wdx2; /* pointer update */
                pi2_dst += 2 * dst_strd - wdx2; /* pointer update */
            }
        }
        else /* wdx2 = multiple of 4 case */
        {
            for(row = 0; row < ht; row += 2)
            {
                for(col = 0; col < wdx2; col += 4)
                {
                    /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */

                    src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                    src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);

                    src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                    src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                    /* storing 16 8-bit output values */
                    _mm_storel_epi64((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                    _mm_storel_epi64((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */

                    pu1_src += 4; /* pointer update */
                    pi2_dst += 4; /* pointer update */
                } /* inner for loop ends here(4-output values in single iteration) */

                pu1_src += 2 * src_strd - wdx2; /* pointer update */
                pi2_dst += 2 * dst_strd - wdx2; /* pointer update */
            }
        }
    }
}